

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-coroutine-test.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::simpleCoroutine<void>
          (anon_unknown_0 *this,Promise<void> *result,Promise<bool> *dontThrow)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<bool> *__return_storage_ptr__;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> handle;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  
  handle._M_fr_ptr = operator_new(0x5c0);
  *(code **)handle._M_fr_ptr = simpleCoroutine<void>;
  *(code **)((long)handle._M_fr_ptr + 8) = simpleCoroutine<void>;
  *(PromiseNode **)((long)handle._M_fr_ptr + 0x5a8) = (result->super_PromiseBase).node.ptr;
  (result->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  *(PromiseNode **)((long)handle._M_fr_ptr + 0x5b0) = (dontThrow->super_PromiseBase).node.ptr;
  (dontThrow->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  _kjCondition.value = (bool *)anon_var_dwarf_144a73;
  location.function = "simpleCoroutine";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
  ;
  location.lineNumber = 0x35;
  location.columnNumber = 0xc;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  __return_storage_ptr__ = (PromiseAwaiter<bool> *)((long)handle._M_fr_ptr + 0x238);
  co_await<bool>(__return_storage_ptr__,(Promise<bool> *)((long)handle._M_fr_ptr + 0x5b0));
  *(undefined1 *)((long)handle._M_fr_ptr + 0x5b8) = 0;
  bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar1) {
    bVar1 = kj::_::PromiseAwaiter<bool>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<bool>::~PromiseAwaiter(__return_storage_ptr__);
    _kjCondition.value = (bool *)((long)handle._M_fr_ptr + 0x5b9);
    *_kjCondition.value = bVar1;
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
                 ,0x3b,FAILED,"resolved","_kjCondition,",&_kjCondition);
      kj::_::Debug::Fault::fatal(&f);
    }
    __return_storage_ptr___00 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x3f0);
    co_await<void>(__return_storage_ptr___00,(Promise<void> *)((long)handle._M_fr_ptr + 0x5a8));
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5b8) = 1;
    bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
    if (!bVar1) {
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___00);
      kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
                ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
      *(undefined8 *)handle._M_fr_ptr = 0;
      *(undefined1 *)((long)handle._M_fr_ptr + 0x5b8) = 2;
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> simpleCoroutine(kj::Promise<T> result, kj::Promise<bool> dontThrow = true) {
  // TODO(cleanup): Storing the coroutine result in a variable to work around
  // https://developercommunity.visualstudio.com/t/certain-coroutines-cause-error-C7587:-/10311276,
  // which caused a compile error here. This was supposed to be resolved with version 17.9, but
  // appears to still be happening as of 17.9.6. Clean up once this has been fixed.
  auto resolved = co_await dontThrow;
  KJ_ASSERT(resolved);
  co_return co_await result;
}